

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gather.cpp
# Opt level: O0

void duckdb::GatherVarchar
               (Vector *rows,SelectionVector *row_sel,Vector *col,SelectionVector *col_sel,
               idx_t count,RowLayout *layout,idx_t col_no,idx_t build_size,data_ptr_t base_heap_ptr)

{
  bool bVar1;
  uint uVar2;
  const_reference pvVar3;
  unsigned_long uVar4;
  SelectionVector *in_RCX;
  SelectionVector *in_RSI;
  ulong in_R8;
  RowLayout *in_R9;
  idx_t in_stack_00000008;
  ulong in_stack_00000010;
  TemplatedValidityMask<unsigned_long> *in_stack_00000018;
  data_ptr_t string_ptr;
  data_ptr_t heap_row_ptr;
  uchar *heap_ptr_ptr;
  ValidityBytes row_mask;
  uchar *col_ptr;
  idx_t col_idx;
  uchar *row;
  idx_t row_idx;
  idx_t i;
  ValidityMask *col_mask;
  string_t *data;
  uchar **ptrs;
  idx_t idx_in_entry;
  idx_t entry_idx;
  idx_t heap_offset;
  value_type col_offset;
  vector<unsigned_long,_true> *offsets;
  size_type in_stack_fffffffffffffeb8;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffec0;
  TemplatedValidityMask<unsigned_char> *in_stack_fffffffffffffec8;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffed0;
  uchar *local_100;
  char *local_f8;
  TemplatedValidityMask<unsigned_long> *local_f0;
  const_data_ptr_t local_e8;
  uchar local_c9 [33];
  undefined1 local_a8 [16];
  const_data_ptr_t local_98;
  idx_t local_90;
  uchar *local_88;
  idx_t local_80;
  ulong local_78;
  TemplatedValidityMask<unsigned_long> *local_70;
  string_t *local_68;
  uchar **local_60;
  idx_t local_58;
  idx_t local_50;
  idx_t local_48;
  value_type local_40;
  vector<unsigned_long,_true> *local_38;
  RowLayout *local_30;
  ulong local_28;
  SelectionVector *local_20;
  SelectionVector *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_38 = RowLayout::GetOffsets(in_R9);
  pvVar3 = vector<unsigned_long,_true>::operator[]
                     ((vector<unsigned_long,_true> *)in_stack_fffffffffffffec0,
                      in_stack_fffffffffffffeb8);
  local_40 = *pvVar3;
  local_48 = RowLayout::GetHeapOffset(local_30);
  TemplatedValidityMask<unsigned_char>::GetEntryIndex(in_stack_00000008,&local_50,&local_58);
  local_60 = FlatVector::GetData<unsigned_char*>((Vector *)0x1593453);
  local_68 = FlatVector::GetData<duckdb::string_t>((Vector *)0x1593468);
  local_70 = &FlatVector::Validity((Vector *)0x159347d)->super_TemplatedValidityMask<unsigned_long>;
  for (local_78 = 0; local_78 < local_28; local_78 = local_78 + 1) {
    local_80 = SelectionVector::get_index(local_10,local_78);
    local_88 = local_60[local_80];
    local_90 = SelectionVector::get_index(local_20,local_78);
    local_98 = local_88 + local_40;
    local_a8 = (undefined1  [16])Load<duckdb::string_t>(local_98);
    *(undefined8 *)&local_68[local_90].value = local_a8._0_8_;
    local_68[local_90].value.pointer.ptr = (char *)local_a8._8_8_;
    RowLayout::ColumnCount((RowLayout *)0x159356f);
    TemplatedValidityMask<unsigned_char>::TemplatedValidityMask
              ((TemplatedValidityMask<unsigned_char> *)in_stack_fffffffffffffed0,
               (uchar *)in_stack_fffffffffffffec8,(idx_t)in_stack_fffffffffffffec0);
    local_c9[0] = TemplatedValidityMask<unsigned_char>::GetValidityEntry
                            (in_stack_fffffffffffffec8,(idx_t)in_stack_fffffffffffffec0);
    bVar1 = TemplatedValidityMask<unsigned_char>::RowIsValid(local_c9,&local_58);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if ((in_stack_00000018 != (TemplatedValidityMask<unsigned_long> *)0x0) &&
         (uVar2 = Load<unsigned_int>(local_98), 0xc < uVar2)) {
        local_e8 = local_88 + local_48;
        in_stack_fffffffffffffed0 = in_stack_00000018;
        uVar4 = Load<unsigned_long>(local_e8);
        in_stack_fffffffffffffec0 =
             (TemplatedValidityMask<unsigned_long> *)
             ((long)&in_stack_fffffffffffffed0->validity_mask + uVar4);
        local_f8 = local_68[local_90].value.inlined.inlined + 4;
        local_f0 = in_stack_fffffffffffffec0;
        in_stack_fffffffffffffec8 =
             (TemplatedValidityMask<unsigned_char> *)Load<unsigned_long>((const_data_ptr_t)local_f8)
        ;
        local_100 = (uchar *)((long)&in_stack_fffffffffffffec8->validity_mask +
                             (long)&in_stack_fffffffffffffec0->validity_mask);
        Store<unsigned_char*>(&local_100,(data_ptr_t)local_f8);
      }
    }
    else {
      if ((0x800 < in_stack_00000010) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_70), bVar1)) {
        TemplatedValidityMask<unsigned_long>::Initialize
                  (in_stack_fffffffffffffed0,(idx_t)in_stack_fffffffffffffec8);
      }
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    }
    TemplatedValidityMask<unsigned_char>::~TemplatedValidityMask
              ((TemplatedValidityMask<unsigned_char> *)0x1593737);
  }
  return;
}

Assistant:

static void GatherVarchar(Vector &rows, const SelectionVector &row_sel, Vector &col, const SelectionVector &col_sel,
                          idx_t count, const RowLayout &layout, idx_t col_no, idx_t build_size,
                          data_ptr_t base_heap_ptr) {
	// Precompute mask indexes
	const auto &offsets = layout.GetOffsets();
	const auto col_offset = offsets[col_no];
	const auto heap_offset = layout.GetHeapOffset();
	idx_t entry_idx;
	idx_t idx_in_entry;
	ValidityBytes::GetEntryIndex(col_no, entry_idx, idx_in_entry);

	auto ptrs = FlatVector::GetData<data_ptr_t>(rows);
	auto data = FlatVector::GetData<string_t>(col);
	auto &col_mask = FlatVector::Validity(col);

	for (idx_t i = 0; i < count; i++) {
		auto row_idx = row_sel.get_index(i);
		auto row = ptrs[row_idx];
		auto col_idx = col_sel.get_index(i);
		auto col_ptr = row + col_offset;
		data[col_idx] = Load<string_t>(col_ptr);
		ValidityBytes row_mask(row, layout.ColumnCount());
		if (!row_mask.RowIsValid(row_mask.GetValidityEntry(entry_idx), idx_in_entry)) {
			if (build_size > STANDARD_VECTOR_SIZE && col_mask.AllValid()) {
				//! We need to initialize the mask with the vector size.
				col_mask.Initialize(build_size);
			}
			col_mask.SetInvalid(col_idx);
		} else if (base_heap_ptr && Load<uint32_t>(col_ptr) > string_t::INLINE_LENGTH) {
			//	Not inline, so unswizzle the copied pointer the pointer
			auto heap_ptr_ptr = row + heap_offset;
			auto heap_row_ptr = base_heap_ptr + Load<idx_t>(heap_ptr_ptr);
			auto string_ptr = data_ptr_t(data + col_idx) + string_t::HEADER_SIZE;
			Store<data_ptr_t>(heap_row_ptr + Load<idx_t>(string_ptr), string_ptr);
#ifdef DEBUG
			data[col_idx].Verify();
#endif
		}
	}
}